

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O2

void poly2_reverse_700(poly2 *out,poly2 *in)

{
  size_t i_1;
  long lVar1;
  crypto_word_t *pcVar2;
  byte bVar3;
  size_t i;
  long lVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong local_70 [3];
  poly2 t;
  
  for (lVar4 = 0; lVar4 != 0xb; lVar4 = lVar4 + 1) {
    uVar6 = in->v[lVar4];
    puVar5 = &word_reverse(unsigned_long)::kMasks;
    for (lVar1 = 0; lVar1 != 6; lVar1 = lVar1 + 1) {
      bVar3 = (byte)(1 << ((byte)lVar1 & 0x1f));
      uVar6 = (*puVar5 & uVar6) << (bVar3 & 0x3f) | uVar6 >> (bVar3 & 0x3f) & *puVar5;
      puVar5 = puVar5 + 1;
    }
    local_70[lVar4] = uVar6;
  }
  pcVar2 = out->v;
  lVar4 = 10;
  while (lVar4 != 0) {
    *pcVar2 = local_70[lVar4 + -1] << 0x3c | local_70[lVar4] >> 4;
    pcVar2 = pcVar2 + 1;
    lVar4 = lVar4 + -1;
  }
  out->v[10] = local_70[0] >> 4;
  return;
}

Assistant:

static void poly2_reverse_700(struct poly2 *out, const struct poly2 *in) {
  struct poly2 t;
  for (size_t i = 0; i < WORDS_PER_POLY; i++) {
    t.v[i] = word_reverse(in->v[i]);
  }

  static const size_t shift = BITS_PER_WORD - ((N - 1) % BITS_PER_WORD);
  for (size_t i = 0; i < WORDS_PER_POLY - 1; i++) {
    out->v[i] = t.v[WORDS_PER_POLY - 1 - i] >> shift;
    out->v[i] |= t.v[WORDS_PER_POLY - 2 - i] << (BITS_PER_WORD - shift);
  }
  out->v[WORDS_PER_POLY - 1] = t.v[0] >> shift;
}